

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * valueAsString<char_const*>(string *__return_storage_ptr__,char *value)

{
  allocator local_9;
  
  if (value == (char *)0x0) {
    value = "(unset)";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,value,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string valueAsString<const char*>(const char* value)
{
  return value ? value : "(unset)";
}